

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O0

int run_benchmark_ping_pongs(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  loop = uv_default_loop();
  start_time = uv_now(loop);
  pinger_new();
  uv_run(loop,UV_RUN_DEFAULT);
  if (completed_pingers != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-pongs.c"
            ,0xd9,"completed_pingers == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-pongs.c"
            ,0xdb,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(ping_pongs) {
  loop = uv_default_loop();

  start_time = uv_now(loop);

  pinger_new();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(completed_pingers == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}